

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  StreamingReporterBase<Catch::ConsoleReporter> *in_RSI;
  TestRunStats *in_RDI;
  Totals *in_stack_000001b8;
  ConsoleReporter *in_stack_000001c0;
  Totals *in_stack_00000548;
  ConsoleReporter *in_stack_00000550;
  
  printTotalsDivider(in_stack_000001c0,in_stack_000001b8);
  printTotals(in_stack_00000550,in_stack_00000548);
  std::ostream::operator<<
            ((void *)(in_RDI->runInfo).name.field_2._M_allocated_capacity,
             std::endl<char,std::char_traits<char>>);
  StreamingReporterBase<Catch::ConsoleReporter>::testRunEnded(in_RSI,in_RDI);
  return;
}

Assistant:

void ConsoleReporter::testRunEnded(TestRunStats const& _testRunStats) {
    printTotalsDivider(_testRunStats.totals);
    printTotals(_testRunStats.totals);
    stream << std::endl;
    StreamingReporterBase::testRunEnded(_testRunStats);
}